

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraBmc.c
# Opt level: O1

Aig_Man_t * Fra_BmcFrames(Fra_Bmc_t *p,int fKeepPos)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  void *pvVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  Aig_Man_t *p_00;
  size_t sVar8;
  char *pcVar9;
  Aig_Obj_t *pAVar10;
  void *pvVar11;
  Aig_Man_t *pAVar12;
  Vec_Ptr_t *pVVar13;
  long lVar14;
  ulong uVar15;
  Aig_Obj_t *p1;
  ulong uVar16;
  int iVar17;
  
  p_00 = Aig_ManStart(p->nFramesAll * p->pAig->vObjs->nSize);
  pAVar12 = p->pAig;
  pcVar2 = pAVar12->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar2);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar2);
  }
  p_00->pName = pcVar9;
  pcVar2 = pAVar12->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar2);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar2);
  }
  p_00->pSpec = pcVar9;
  iVar17 = p->nFramesAll;
  if (0 < iVar17) {
    lVar14 = 0;
    do {
      pAVar10 = p->pAig->pConst1;
      lVar3 = *(long *)((long)(pAVar10->field_5).pData + 0x40);
      *(Aig_Obj_t **)
       (*(long *)(lVar3 + 0x30) + ((long)pAVar10->Id * (long)*(int *)(lVar3 + 8) + lVar14) * 8) =
           p_00->pConst1;
      lVar14 = lVar14 + 1;
    } while (iVar17 != (int)lVar14);
  }
  if (0 < p->nFramesAll) {
    iVar17 = 0;
    do {
      pAVar12 = p->pAig;
      if (pAVar12->nRegs < pAVar12->nObjs[2]) {
        lVar14 = 0;
        do {
          if (pAVar12->vCis->nSize <= lVar14) goto LAB_005c0a5f;
          pvVar11 = pAVar12->vCis->pArray[lVar14];
          pAVar10 = Aig_ObjCreateCi(p_00);
          lVar3 = *(long *)(*(long *)((long)pvVar11 + 0x28) + 0x40);
          *(Aig_Obj_t **)
           (*(long *)(lVar3 + 0x30) +
           (long)(*(int *)((long)pvVar11 + 0x24) * *(int *)(lVar3 + 8) + iVar17) * 8) = pAVar10;
          lVar14 = lVar14 + 1;
          pAVar12 = p->pAig;
        } while (lVar14 < (long)pAVar12->nObjs[2] - (long)pAVar12->nRegs);
      }
      iVar17 = iVar17 + 1;
    } while (iVar17 < p->nFramesAll);
  }
  pAVar12 = p->pAig;
  uVar7 = pAVar12->nObjs[2] - pAVar12->nRegs;
  pVVar13 = pAVar12->vCis;
  if ((int)uVar7 < pVVar13->nSize) {
    uVar15 = (ulong)uVar7;
    do {
      if ((int)uVar7 < 0) {
LAB_005c0a5f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      lVar14 = *(long *)(*(long *)((long)pVVar13->pArray[uVar15] + 0x28) + 0x40);
      *(ulong *)(*(long *)(lVar14 + 0x30) +
                (long)*(int *)((long)pVVar13->pArray[uVar15] + 0x24) * (long)*(int *)(lVar14 + 8) *
                8) = (ulong)p_00->pConst1 ^ 1;
      uVar15 = uVar15 + 1;
      pAVar12 = p->pAig;
      pVVar13 = pAVar12->vCis;
    } while ((int)uVar15 < pVVar13->nSize);
  }
  pvVar11 = malloc((long)pAVar12->nRegs << 3);
  if (0 < p->nFramesAll) {
    iVar17 = 0;
    while( true ) {
      pAVar12 = p->pAig;
      pVVar13 = pAVar12->vObjs;
      if (0 < pVVar13->nSize) {
        lVar14 = 0;
        do {
          pvVar4 = pVVar13->pArray[lVar14];
          if ((pvVar4 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar4 + 0x18) & 7) - 7)) {
            if (((ulong)pvVar4 & 1) != 0) goto LAB_005c0a7e;
            uVar15 = *(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe;
            if (uVar15 == 0) {
              pAVar10 = (Aig_Obj_t *)0x0;
            }
            else {
              lVar3 = *(long *)(*(long *)(uVar15 + 0x28) + 0x40);
              pAVar10 = (Aig_Obj_t *)
                        ((ulong)((uint)*(ulong *)((long)pvVar4 + 8) & 1) ^
                        *(ulong *)(*(long *)(lVar3 + 0x30) +
                                  (long)(*(int *)(uVar15 + 0x24) * *(int *)(lVar3 + 8) + iVar17) * 8
                                  ));
            }
            uVar15 = *(ulong *)((long)pvVar4 + 0x10) & 0xfffffffffffffffe;
            if (uVar15 == 0) {
              p1 = (Aig_Obj_t *)0x0;
            }
            else {
              lVar3 = *(long *)(*(long *)(uVar15 + 0x28) + 0x40);
              p1 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar4 + 0x10) & 1) ^
                   *(ulong *)(*(long *)(lVar3 + 0x30) +
                             (long)(*(int *)(uVar15 + 0x24) * *(int *)(lVar3 + 8) + iVar17) * 8));
            }
            pAVar10 = Aig_And(p_00,pAVar10,p1);
            lVar3 = *(long *)(*(long *)((long)pvVar4 + 0x28) + 0x40);
            *(Aig_Obj_t **)
             (*(long *)(lVar3 + 0x30) +
             (long)(*(int *)((long)pvVar4 + 0x24) * *(int *)(lVar3 + 8) + iVar17) * 8) = pAVar10;
          }
          lVar14 = lVar14 + 1;
          pAVar12 = p->pAig;
          pVVar13 = pAVar12->vObjs;
        } while (lVar14 < pVVar13->nSize);
      }
      if (iVar17 == p->nFramesAll + -1) break;
      iVar1 = pAVar12->nRegs;
      uVar7 = pAVar12->nObjs[3] - iVar1;
      pVVar13 = pAVar12->vCos;
      lVar14 = 0;
      if ((int)uVar7 < pVVar13->nSize) {
        lVar14 = 0;
        do {
          if ((int)uVar7 < 0) goto LAB_005c0a5f;
          if (((ulong)pVVar13->pArray[(ulong)uVar7 + lVar14] & 1) != 0) goto LAB_005c0a7e;
          uVar15 = *(ulong *)((long)pVVar13->pArray[(ulong)uVar7 + lVar14] + 8);
          uVar16 = uVar15 & 0xfffffffffffffffe;
          if (uVar16 == 0) {
            uVar15 = 0;
          }
          else {
            lVar3 = *(long *)(*(long *)(uVar16 + 0x28) + 0x40);
            uVar15 = (ulong)((uint)uVar15 & 1) ^
                     *(ulong *)(*(long *)(lVar3 + 0x30) +
                               (long)(*(int *)(uVar16 + 0x24) * *(int *)(lVar3 + 8) + iVar17) * 8);
          }
          *(ulong *)((long)pvVar11 + lVar14 * 8) = uVar15;
          lVar14 = lVar14 + 1;
          pVVar13 = pAVar12->vCos;
        } while ((int)((int)lVar14 + uVar7) < pVVar13->nSize);
      }
      if ((int)lVar14 != iVar1) {
        __assert_fail("k == Aig_ManRegNum(p->pAig)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraBmc.c"
                      ,0x112,"Aig_Man_t *Fra_BmcFrames(Fra_Bmc_t *, int)");
      }
      uVar7 = pAVar12->nObjs[2] - iVar1;
      pAVar12 = p->pAig;
      pVVar13 = pAVar12->vCis;
      lVar14 = 0;
      if ((int)uVar7 < pVVar13->nSize) {
        lVar14 = 0;
        do {
          if ((int)uVar7 < 0) goto LAB_005c0a5f;
          lVar6 = (ulong)uVar7 + lVar14;
          lVar3 = lVar14 * 8;
          lVar14 = lVar14 + 1;
          lVar5 = *(long *)(*(long *)((long)pVVar13->pArray[lVar6] + 0x28) + 0x40);
          *(undefined8 *)
           (*(long *)(lVar5 + 0x30) +
           (long)(*(int *)((long)pVVar13->pArray[lVar6] + 0x24) * *(int *)(lVar5 + 8) + iVar17 + 1)
           * 8) = *(undefined8 *)((long)pvVar11 + lVar3);
          pAVar12 = p->pAig;
          pVVar13 = pAVar12->vCis;
        } while ((int)((int)lVar14 + uVar7) < pVVar13->nSize);
      }
      if ((int)lVar14 != pAVar12->nRegs) {
        __assert_fail("k == Aig_ManRegNum(p->pAig)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraBmc.c"
                      ,0x117,"Aig_Man_t *Fra_BmcFrames(Fra_Bmc_t *, int)");
      }
      iVar17 = iVar17 + 1;
      if (p->nFramesAll <= iVar17) break;
    }
  }
  if (pvVar11 != (void *)0x0) {
    free(pvVar11);
  }
  if (fKeepPos == 0) {
    pVVar13 = p_00->vObjs;
    if (0 < pVVar13->nSize) {
      lVar14 = 0;
      do {
        pAVar10 = (Aig_Obj_t *)pVVar13->pArray[lVar14];
        if (((pAVar10 != (Aig_Obj_t *)0x0) && ((*(ulong *)&pAVar10->field_0x18 & 0xffffffc0) == 0))
           && (((uint)*(ulong *)&pAVar10->field_0x18 & 7) - 5 < 2)) {
          Aig_ObjCreateCo(p_00,pAVar10);
        }
        lVar14 = lVar14 + 1;
        pVVar13 = p_00->vObjs;
      } while (lVar14 < pVVar13->nSize);
    }
  }
  else {
    if (0 < p->nFramesAll) {
      iVar17 = 0;
      do {
        pAVar12 = p->pAig;
        if (pAVar12->nRegs < pAVar12->nObjs[3]) {
          lVar14 = 0;
          do {
            if (pAVar12->vCos->nSize <= lVar14) goto LAB_005c0a5f;
            pvVar11 = pAVar12->vCos->pArray[lVar14];
            if (((ulong)pvVar11 & 1) != 0) {
LAB_005c0a7e:
              __assert_fail("!Aig_IsComplement(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraBmc.c"
                            ,0x36,"Aig_Obj_t *Bmc_ObjChild0Frames(Aig_Obj_t *, int)");
            }
            uVar15 = *(ulong *)((long)pvVar11 + 8);
            uVar16 = uVar15 & 0xfffffffffffffffe;
            if (uVar16 == 0) {
              pAVar10 = (Aig_Obj_t *)0x0;
            }
            else {
              lVar3 = *(long *)(*(long *)(uVar16 + 0x28) + 0x40);
              pAVar10 = (Aig_Obj_t *)
                        ((ulong)((uint)uVar15 & 1) ^
                        *(ulong *)(*(long *)(lVar3 + 0x30) +
                                  (long)(*(int *)(uVar16 + 0x24) * *(int *)(lVar3 + 8) + iVar17) * 8
                                  ));
            }
            Aig_ObjCreateCo(p_00,pAVar10);
            lVar14 = lVar14 + 1;
            pAVar12 = p->pAig;
          } while (lVar14 < (long)pAVar12->nObjs[3] - (long)pAVar12->nRegs);
        }
        iVar17 = iVar17 + 1;
      } while (iVar17 < p->nFramesAll);
    }
    Aig_ManCleanup(p_00);
  }
  return p_00;
}

Assistant:

Aig_Man_t * Fra_BmcFrames( Fra_Bmc_t * p, int fKeepPos )
{
    Aig_Man_t * pAigFrames;
    Aig_Obj_t * pObj, * pObjNew;
    Aig_Obj_t ** pLatches;
    int i, k, f;

    // start the fraig package
    pAigFrames = Aig_ManStart( Aig_ManObjNumMax(p->pAig) * p->nFramesAll );
    pAigFrames->pName = Abc_UtilStrsav( p->pAig->pName );
    pAigFrames->pSpec = Abc_UtilStrsav( p->pAig->pSpec );
    // create PI nodes for the frames
    for ( f = 0; f < p->nFramesAll; f++ )
        Bmc_ObjSetFrames( Aig_ManConst1(p->pAig), f, Aig_ManConst1(pAigFrames) );
    for ( f = 0; f < p->nFramesAll; f++ )
        Aig_ManForEachPiSeq( p->pAig, pObj, i )
            Bmc_ObjSetFrames( pObj, f, Aig_ObjCreateCi(pAigFrames) );
    // set initial state for the latches
    Aig_ManForEachLoSeq( p->pAig, pObj, i )
        Bmc_ObjSetFrames( pObj, 0, Aig_ManConst0(pAigFrames) );

    // add timeframes
    pLatches = ABC_ALLOC( Aig_Obj_t *, Aig_ManRegNum(p->pAig) );
    for ( f = 0; f < p->nFramesAll; f++ )
    {
        // add internal nodes of this frame
        Aig_ManForEachNode( p->pAig, pObj, i )
        {
            pObjNew = Aig_And( pAigFrames, Bmc_ObjChild0Frames(pObj,f), Bmc_ObjChild1Frames(pObj,f) );
            Bmc_ObjSetFrames( pObj, f, pObjNew );
        }
        if ( f == p->nFramesAll - 1 )
            break;
        // save the latch input values
        k = 0;
        Aig_ManForEachLiSeq( p->pAig, pObj, i )
            pLatches[k++] = Bmc_ObjChild0Frames(pObj,f);
        assert( k == Aig_ManRegNum(p->pAig) );
        // insert them to the latch output values
        k = 0;
        Aig_ManForEachLoSeq( p->pAig, pObj, i )
            Bmc_ObjSetFrames( pObj, f+1, pLatches[k++] );
        assert( k == Aig_ManRegNum(p->pAig) );
    }
    ABC_FREE( pLatches );
    if ( fKeepPos )
    {
        for ( f = 0; f < p->nFramesAll; f++ )
            Aig_ManForEachPoSeq( p->pAig, pObj, i )
                Aig_ObjCreateCo( pAigFrames, Bmc_ObjChild0Frames(pObj,f) );
        Aig_ManCleanup( pAigFrames );
    }
    else
    {
        // add POs to all the dangling nodes
        Aig_ManForEachObj( pAigFrames, pObjNew, i )
            if ( Aig_ObjIsNode(pObjNew) && pObjNew->nRefs == 0 )
                Aig_ObjCreateCo( pAigFrames, pObjNew );
    }
    // return the new manager
    return pAigFrames;
}